

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR set_assign_pos(lyxp_set *set,lyd_node *root,lyxp_node_type root_type)

{
  lyxp_set_node *plVar1;
  lysc_node *plVar2;
  lyd_node_inner *plVar3;
  lyd_node_inner *plVar4;
  lyxp_set_node *plVar5;
  ulong uVar6;
  lyd_node_inner *plVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  lyd_node_inner *plVar10;
  lyd_node_inner *plVar11;
  lys_module *plVar12;
  lyd_node_inner *plVar13;
  uint32_t uVar14;
  bool bVar15;
  lyd_node_inner *local_58;
  
  uVar6 = 0;
  plVar10 = (lyd_node_inner *)0x0;
  uVar8 = 0;
  do {
    if (set->used <= uVar6) {
      return LY_SUCCESS;
    }
    plVar5 = (set->val).nodes;
    if (plVar5[uVar6].pos == 0) {
      plVar1 = plVar5 + uVar6;
      if (plVar1->type - LYXP_NODE_ELEM < 2) {
        plVar11 = (lyd_node_inner *)plVar1->node;
      }
      else {
        if (plVar1->type != LYXP_NODE_META) goto LAB_001a0607;
        plVar11 = *(lyd_node_inner **)plVar1->node;
        if (plVar11 == (lyd_node_inner *)0x0) {
          ly_log(root->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                 0x610);
          return LY_EINT;
        }
      }
      if (root->prev->next != (lyd_node *)0x0) {
        __assert_fail("prev && prev_pos && !root->prev->next",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x5b9,
                      "uint32_t get_node_pos(const struct lyd_node *, enum lyxp_node_type, const struct lyd_node *, enum lyxp_node_type, const struct lyd_node **, uint32_t *)"
                     );
      }
      plVar13 = plVar10;
      if (plVar10 == (lyd_node_inner *)0x0) {
        local_58 = (lyd_node_inner *)0x0;
        plVar10 = (lyd_node_inner *)0x0;
        plVar13 = (lyd_node_inner *)0x0;
        uVar14 = 1;
        plVar4 = (lyd_node_inner *)root;
        goto LAB_001a04f0;
      }
      do {
        plVar7 = plVar13;
        plVar13 = *(lyd_node_inner **)((long)&plVar7->field_0 + 0x10);
      } while (plVar13 != (lyd_node_inner *)0x0);
      plVar4 = (lyd_node_inner *)0x0;
      plVar3 = plVar10;
      uVar14 = uVar8;
LAB_001a0528:
      do {
        local_58 = plVar3;
        plVar13 = plVar10;
        if (plVar4 != (lyd_node_inner *)0x0) {
          plVar13 = plVar4;
        }
        if (plVar10 == (lyd_node_inner *)0x0) {
          plVar13 = plVar4;
        }
        if (((root_type == LYXP_NODE_ROOT_CONFIG) &&
            (plVar2 = (plVar13->field_0).node.schema, plVar2 != (lysc_node *)0x0)) &&
           ((plVar2->flags & 2) != 0)) {
LAB_001a0569:
          if (plVar13 != plVar7) {
            plVar4 = (lyd_node_inner *)(plVar13->field_0).node.next;
LAB_001a057c:
            while (plVar3 = local_58, plVar4 == (lyd_node_inner *)0x0) {
              plVar13 = (plVar13->field_0).node.parent;
              if ((plVar13->field_0).node.parent == (plVar7->field_0).node.parent) {
                plVar13 = (lyd_node_inner *)0x0;
                goto LAB_001a059b;
              }
              plVar4 = (lyd_node_inner *)(plVar13->field_0).node.next;
            }
            goto LAB_001a0528;
          }
LAB_001a059b:
          plVar4 = (lyd_node_inner *)(plVar7->field_0).node.next;
LAB_001a04f0:
          bVar15 = true;
          plVar7 = plVar4;
          plVar3 = local_58;
          if (plVar4 != (lyd_node_inner *)0x0) goto LAB_001a0528;
        }
        else {
          if (plVar13 != plVar11) {
            uVar14 = uVar14 + 1;
            plVar4 = (lyd_node_inner *)lyd_child((lyd_node *)plVar13);
            if (plVar4 == (lyd_node_inner *)0x0) goto LAB_001a0569;
            goto LAB_001a057c;
          }
          bVar15 = false;
        }
        plVar4 = plVar13;
        uVar9 = uVar14;
        if (!bVar15) goto LAB_001a0602;
        uVar14 = 1;
        bVar15 = plVar10 != (lyd_node_inner *)0x0;
        plVar7 = (lyd_node_inner *)root;
        plVar10 = (lyd_node_inner *)root;
        plVar3 = (lyd_node_inner *)root;
      } while (bVar15);
      plVar2 = (plVar11->field_0).node.schema;
      if (plVar2 == (lysc_node *)0x0) {
        plVar12 = (lys_module *)((long)&plVar11[1].field_0 + 0x30);
      }
      else {
        plVar12 = plVar2->module;
      }
      uVar14 = 0;
      ly_log(plVar12->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",0x5e8)
      ;
      plVar5 = (set->val).nodes;
      plVar11 = local_58;
      uVar9 = uVar8;
LAB_001a0602:
      plVar5[uVar6].pos = uVar14;
      plVar10 = plVar11;
      uVar8 = uVar9;
    }
LAB_001a0607:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static LY_ERR
set_assign_pos(struct lyxp_set *set, const struct lyd_node *root, enum lyxp_node_type root_type)
{
    const struct lyd_node *prev = NULL, *tmp_node;
    uint32_t i, tmp_pos = 0;

    for (i = 0; i < set->used; ++i) {
        if (!set->val.nodes[i].pos) {
            tmp_node = NULL;
            switch (set->val.nodes[i].type) {
            case LYXP_NODE_META:
                tmp_node = set->val.meta[i].meta->parent;
                if (!tmp_node) {
                    LOGINT_RET(root->schema->module->ctx);
                }
            /* fall through */
            case LYXP_NODE_ELEM:
            case LYXP_NODE_TEXT:
                if (!tmp_node) {
                    tmp_node = set->val.nodes[i].node;
                }
                set->val.nodes[i].pos = get_node_pos(tmp_node, set->val.nodes[i].type, root, root_type, &prev, &tmp_pos);
                break;
            default:
                /* all roots have position 0 */
                break;
            }
        }
    }

    return LY_SUCCESS;
}